

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getFloat32List
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder builder;
  uint ptrIndex;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<13u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,ptrIndex);
  builder.capTable = local_28.capTable;
  builder.segment = local_28.segment;
  builder.pointer = local_28.pointer;
  ::capnp::_::PointerHelpers<capnp::List<float,_(capnp::Kind)0>,_(capnp::Kind)6>::get
            (__return_storage_ptr__,builder,(word *)&DAT_00472910);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List<float,  ::capnp::Kind::PRIMITIVE>::Builder TestDefaults::Builder::getFloat32List() {
  return ::capnp::_::PointerHelpers< ::capnp::List<float,  ::capnp::Kind::PRIMITIVE>>::get(_builder.getPointerField(
      ::capnp::bounded<13>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 771);
}